

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O2

ostream * test_detail::print_tuple_impl<std::tuple<int,int,int>,0ul,1ul,2ul>(ostream *stream,int *t)

{
  ostream *poVar1;
  
  std::operator<<(stream,"(");
  std::ostream::operator<<(stream,t[2]);
  poVar1 = std::operator<<(stream,", ");
  std::ostream::operator<<(poVar1,t[1]);
  poVar1 = std::operator<<(stream,", ");
  std::ostream::operator<<(poVar1,*t);
  std::operator<<(stream,")");
  return stream;
}

Assistant:

std::ostream & print_tuple_impl (std::ostream & stream, const Tuple & t, std::index_sequence<Head, Tail...>)
    {
        stream << "(";
        stream << std::get<Head>(t);
        auto x = {(stream << ", " << std::get<Tail>(t), 0)...};
        static_cast<void>(x);
        stream << ")";

        return stream;
    }